

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# runtest.c
# Opt level: O3

int pushBoundaryTest(char *filename,char *result,char *err,int options)

{
  char *pcVar1;
  undefined8 uVar2;
  char *filename_00;
  int iVar3;
  code *pcVar4;
  long lVar5;
  size_t sVar6;
  ulong uVar7;
  code *pcVar8;
  undefined8 *puVar9;
  byte *pbVar10;
  ulong uVar11;
  byte *pbVar12;
  uint uVar13;
  ulong uVar14;
  long lVar15;
  long lVar16;
  undefined8 *puVar17;
  char *pcVar18;
  bool bVar19;
  bool bVar20;
  int size;
  char *base;
  uint local_184;
  char *local_180;
  char *local_178;
  byte *local_170;
  int local_164;
  char *local_160;
  char *local_158;
  long local_150;
  ulong local_148;
  ulong local_140;
  char *local_138;
  code *local_130 [14];
  undefined8 local_c0;
  undefined8 local_b8;
  code *local_b0;
  code *local_a8;
  code *local_98;
  code *local_90;
  code *local_68;
  undefined8 local_48;
  undefined8 local_40 [2];
  
  iVar3 = strcmp(filename,"./test/HTML/xml-declaration-1.html");
  if (iVar3 == 0) {
    return 0;
  }
  nb_tests = nb_tests + 1;
  memset(local_130,0,0x100);
  if (((uint)options >> 0x1e & 1) == 0) {
    puVar9 = local_40;
    puVar17 = &local_48;
    xmlSAXVersion(local_130,2);
    pcVar4 = endElementNsBnd;
    pcVar8 = startElementNsBnd;
  }
  else {
    puVar9 = &local_b8;
    puVar17 = &local_c0;
    xmlSAX2InitHtmlDefaultSAXHandler(local_130);
    pcVar4 = endElementBnd;
    pcVar8 = startElementBnd;
  }
  *puVar17 = pcVar8;
  *puVar9 = pcVar4;
  local_130[0] = internalSubsetBnd;
  local_b0 = referenceBnd;
  local_a8 = charactersBnd;
  local_68 = cdataBlockBnd;
  local_98 = processingInstructionBnd;
  local_90 = commentBnd;
  iVar3 = loadMem(filename,&local_178,(int *)&local_184);
  pcVar18 = local_178;
  if (iVar3 == 0) {
    if (((uint)options >> 0x1e & 1) == 0) {
      lVar5 = xmlCreatePushParserCtxt(local_130,0,local_178,1,filename);
    }
    else {
      lVar5 = htmlCreatePushParserCtxt(local_130,0,local_178,1,filename);
    }
    local_180 = filename;
    local_160 = err;
    local_158 = result;
    xmlCtxtSetErrorHandler(lVar5,testStructuredErrorHandler,0);
    pbVar12 = (byte *)(ulong)(uint)options;
    xmlCtxtUseOptions(lVar5);
    uVar7 = (ulong)local_184;
    local_138 = pcVar18;
    if ((int)local_184 < 2) {
      bVar19 = true;
      uVar11 = 0;
      pbVar10 = (byte *)0x0;
      uVar14 = 0;
      local_170 = pbVar12;
    }
    else {
      local_140 = 1;
      if ((options & 0x40000000U) != 0) {
        local_140 = 0x20;
      }
      iVar3 = *(int *)(lVar5 + 0x110);
      lVar15 = *(long *)(lVar5 + 0x38);
      lVar16 = 2;
      local_150 = lVar5;
      do {
        pcVar18 = pcVar18 + 1;
        if (iVar3 == 7) {
          local_170 = *(byte **)(lVar15 + 0x20);
          if (local_170 < *(byte **)(lVar15 + 0x28)) {
            uVar13 = (uint)*local_170;
          }
          else {
            uVar13 = (uint)*pcVar18;
          }
          if (((uint)options >> 0x1e & 1) == 0) {
            bVar19 = uVar13 != 0x26 && uVar13 != 0x3c;
          }
          else {
            bVar19 = uVar13 != 0x3c || *(int *)(local_150 + 0x2f0) != 0;
          }
          bVar19 = (bool)(bVar19 ^ 1);
        }
        else {
          local_170 = *(byte **)(lVar15 + 0x20);
          bVar19 = true;
        }
        local_170 = local_170 + (*(long *)(lVar15 + 0x40) - *(long *)(lVar15 + 0x18));
        pushBoundaryCount = 0;
        pushBoundaryRefCount = 0;
        pushBoundaryCharsCount = 0;
        pushBoundaryCDataCount = 0;
        if (((uint)options >> 0x1e & 1) == 0) {
          xmlParseChunk(local_150,pcVar18,1,(int)uVar7 <= lVar16);
        }
        else {
          htmlParseChunk();
        }
        uVar14 = 1;
        if (pushBoundaryRefCount < 1) {
          uVar13 = pushBoundaryCount;
          if (1 < pushBoundaryCharsCount) {
            if (((uint)options >> 0x1e & 1) == 0) {
              uVar14 = (ulong)(pushBoundaryCount - 1);
              goto LAB_00109c6e;
            }
            uVar13 = (pushBoundaryCount - pushBoundaryCharsCount) + 1;
          }
          uVar14 = (ulong)uVar13;
          if ((1 < pushBoundaryCDataCount & (byte)((uint)options >> 0x1e)) == 1) {
            uVar14 = (ulong)((uVar13 - pushBoundaryCDataCount) + 1);
          }
        }
LAB_00109c6e:
        lVar15 = *(long *)(local_150 + 0x38);
        pcVar1 = *(char **)(lVar15 + 0x20);
        pbVar10 = (byte *)(pcVar1 + (*(long *)(lVar15 + 0x40) - *(long *)(lVar15 + 0x18)));
        iVar3 = *(int *)(local_150 + 0x110);
        if ((iVar3 == 3) || (pbVar10 < (byte *)0x4)) {
          uVar11 = 0;
        }
        else {
          uVar11 = 0;
          if (pbVar10 != local_170) {
            lVar5 = *(long *)(lVar15 + 0x28);
            if ((((uint)options >> 0x1e & 1) == 0) || (uVar7 = 3, iVar3 != 9)) {
              if (bVar19) {
                uVar7 = (ulong)(iVar3 == 8) * 5;
              }
              else if ((((uint)options >> 0x1e & 1) == 0) || (*(int *)(local_150 + 0x2f0) == 0)) {
                if (*pcVar1 == '<') {
                  uVar7 = 1;
                }
                else {
                  uVar7 = local_140;
                  if (*pcVar1 != '&') {
                    uVar7 = 3;
                  }
                }
              }
              else {
                local_164 = iVar3;
                local_148 = uVar14;
                sVar6 = strlen(*(char **)(local_150 + 0x120));
                uVar7 = sVar6 + 2;
                uVar14 = local_148;
                iVar3 = local_164;
              }
            }
            uVar11 = lVar5 - (long)pcVar1;
            if (uVar11 <= uVar7) {
              uVar11 = 0;
            }
          }
        }
        uVar7 = (ulong)(int)local_184;
        bVar19 = uVar11 == 0;
        lVar5 = local_150;
      } while (((lVar16 < (long)uVar7) && ((int)uVar14 < 2)) && (lVar16 = lVar16 + 1, uVar11 == 0));
    }
    if (((uint)options >> 0x1e & 1) == 0) {
      bVar20 = *(int *)(lVar5 + 0x18) == 0;
    }
    else {
      bVar20 = false;
    }
    uVar2 = *(undefined8 *)(lVar5 + 0x10);
    xmlFreeParserCtxt();
    free(local_138);
    if (1 < (int)uVar14) {
      xmlFreeDoc(uVar2);
      fprintf(_stderr,"Failed push boundary callback test (%d@%lu-%lu): %s\n",uVar14 & 0xffffffff,
              local_170,pbVar10,local_180);
      return -1;
    }
    if (!bVar19) {
      xmlFreeDoc(uVar2);
      fprintf(_stderr,"Failed push boundary buffer test (%lu@%lu): %s\n",uVar11,pbVar10,local_180);
      return -1;
    }
    if (bVar20) {
      xmlFreeDoc(uVar2);
      pcVar18 = "Failed to parse %s\n";
      filename = local_180;
    }
    else {
      if (((uint)options >> 0x1e & 1) == 0) {
        xmlDocDumpMemory(uVar2,&local_178,&local_184);
      }
      else {
        htmlDocDumpMemory();
      }
      filename_00 = local_158;
      pcVar1 = local_160;
      xmlFreeDoc(uVar2);
      iVar3 = compareFileMem(filename_00,local_178,local_184);
      pcVar18 = local_180;
      if ((local_178 == (char *)0x0) || (iVar3 != 0)) {
        if (local_178 != (char *)0x0) {
          (*_xmlFree)();
        }
        fprintf(_stderr,"Result for %s failed in %s\n",pcVar18,filename_00);
        return -1;
      }
      (*_xmlFree)();
      filename = local_180;
      if (pcVar1 == (char *)0x0) {
        return 0;
      }
      iVar3 = compareFileMem(pcVar1,testErrors,testErrorsSize);
      if (iVar3 == 0) {
        return 0;
      }
      pcVar18 = "Error for %s failed\n";
    }
  }
  else {
    pcVar18 = "Failed to load %s\n";
  }
  fprintf(_stderr,pcVar18,filename);
  return -1;
}

Assistant:

static int
pushBoundaryTest(const char *filename, const char *result,
                 const char *err ATTRIBUTE_UNUSED,
                 int options) {
    xmlParserCtxtPtr ctxt;
    xmlDocPtr doc;
    xmlSAXHandler bndSAX;
    const char *base;
    int size, res, numCallbacks;
    int cur = 0;
    unsigned long avail, oldConsumed, consumed;

    /*
     * HTML encoding detection doesn't work when data is fed bytewise.
     */
    if (strcmp(filename, "./test/HTML/xml-declaration-1.html") == 0)
        return(0);

    /*
     * If the parser made progress, check that exactly one construct was
     * processed and that the input buffer is (almost) empty.
     * Since we use a chunk size of 1, this tests whether content is
     * processed as early as possible.
     */

    nb_tests++;

    memset(&bndSAX, 0, sizeof(bndSAX));
#ifdef LIBXML_HTML_ENABLED
    if (options & XML_PARSE_HTML) {
        xmlSAX2InitHtmlDefaultSAXHandler(&bndSAX);
        bndSAX.startElement = startElementBnd;
        bndSAX.endElement = endElementBnd;
    } else
#endif
    {
        xmlSAXVersion(&bndSAX, 2);
        bndSAX.startElementNs = startElementNsBnd;
        bndSAX.endElementNs = endElementNsBnd;
    }

    bndSAX.internalSubset = internalSubsetBnd;
    bndSAX.reference = referenceBnd;
    bndSAX.characters = charactersBnd;
    bndSAX.cdataBlock = cdataBlockBnd;
    bndSAX.processingInstruction = processingInstructionBnd;
    bndSAX.comment = commentBnd;

    /*
     * load the document in memory and work from there.
     */
    if (loadMem(filename, &base, &size) != 0) {
        fprintf(stderr, "Failed to load %s\n", filename);
	return(-1);
    }

#ifdef LIBXML_HTML_ENABLED
    if (options & XML_PARSE_HTML)
	ctxt = htmlCreatePushParserCtxt(&bndSAX, NULL, base, 1, filename,
	                                XML_CHAR_ENCODING_NONE);
    else
#endif
    ctxt = xmlCreatePushParserCtxt(&bndSAX, NULL, base, 1, filename);
    xmlCtxtSetErrorHandler(ctxt, testStructuredErrorHandler, NULL);
    xmlCtxtUseOptions(ctxt, options);
    cur = 1;
    consumed = 0;
    numCallbacks = 0;
    avail = 0;
    while ((cur < size) && (numCallbacks <= 1) && (avail <= 0)) {
        int terminate = (cur + 1 >= size);
        int isText = 0;

        if (ctxt->instate == XML_PARSER_CONTENT) {
            int firstChar = (ctxt->input->end > ctxt->input->cur) ?
                            *ctxt->input->cur :
                            base[cur];

            if (options & XML_PARSE_HTML) {
                isText = ((ctxt->endCheckState) || (firstChar != '<'));
            } else {
                isText = ((firstChar != '<') && (firstChar != '&'));
            }
        }

        oldConsumed = ctxt->input->consumed +
                      (unsigned long) (ctxt->input->cur - ctxt->input->base);

        pushBoundaryCount = 0;
        pushBoundaryRefCount = 0;
        pushBoundaryCharsCount = 0;
        pushBoundaryCDataCount = 0;

#ifdef LIBXML_HTML_ENABLED
        if (options & XML_PARSE_HTML)
            htmlParseChunk(ctxt, base + cur, 1, terminate);
        else
#endif
        xmlParseChunk(ctxt, base + cur, 1, terminate);
	cur += 1;

        /*
         * Callback check: Check that only a single construct was parsed.
         */
        if (pushBoundaryRefCount > 0) {
            numCallbacks = 1;
        } else {
            numCallbacks = pushBoundaryCount;
            if (pushBoundaryCharsCount > 1) {
                if (options & XML_PARSE_HTML) {
                    /*
                     * The HTML parser can generate a mix of chars and
                     * references.
                     */
                    numCallbacks -= pushBoundaryCharsCount - 1;
                } else {
                    /*
                     * Allow two chars callbacks. This can happen when
                     * multi-byte chars are split across buffer boundaries.
                     */
                    numCallbacks -= 1;
                }
            }
            if (options & XML_PARSE_HTML) {
                /*
                 * Allow multiple cdata callbacks in HTML mode.
                 */
                if (pushBoundaryCDataCount > 1)
                    numCallbacks -= pushBoundaryCDataCount - 1;
            }
        }

        /*
         * Buffer check: If input was consumed, check that the input
         * buffer is (almost) empty.
         */
        consumed = ctxt->input->consumed +
                   (unsigned long) (ctxt->input->cur - ctxt->input->base);
        if ((ctxt->instate != XML_PARSER_DTD) &&
            (consumed >= 4) &&
            (consumed != oldConsumed)) {
            size_t max = 0;

            avail = ctxt->input->end - ctxt->input->cur;

            if ((options & XML_PARSE_HTML) &&
                (ctxt->instate == XML_PARSER_END_TAG)) {
                /* Something related to script parsing. */
                max = 3;
            } else if (isText) {
                int c = *ctxt->input->cur;

                if ((options & XML_PARSE_HTML) &&
                    (ctxt->endCheckState)) {
                    max = strlen((const char *) ctxt->name) + 2;
                } else if (c == '&') {
                    max = (options & XML_PARSE_HTML) ? 32 : 1;
                } else if (c == '<') {
                    max = 1;
                } else {
                    /* 3 bytes for partial UTF-8 */
                    max = 3;
                }
            } else if (ctxt->instate == XML_PARSER_CDATA_SECTION) {
                /* 2 bytes for terminator, 3 bytes for UTF-8 */
                max = 5;
            }

            if (avail <= max)
                avail = 0;
        }
    }
    doc = ctxt->myDoc;
#ifdef LIBXML_HTML_ENABLED
    if (options & XML_PARSE_HTML)
        res = 1;
    else
#endif
    res = ctxt->wellFormed;
    xmlFreeParserCtxt(ctxt);
    free((char *)base);
    if (numCallbacks > 1) {
	xmlFreeDoc(doc);
	fprintf(stderr, "Failed push boundary callback test (%d@%lu-%lu): %s\n",
                numCallbacks, oldConsumed, consumed, filename);
	return(-1);
    }
    if (avail > 0) {
	xmlFreeDoc(doc);
	fprintf(stderr, "Failed push boundary buffer test (%lu@%lu): %s\n",
                avail, consumed, filename);
	return(-1);
    }
    if (!res) {
	xmlFreeDoc(doc);
	fprintf(stderr, "Failed to parse %s\n", filename);
	return(-1);
    }
#ifdef LIBXML_HTML_ENABLED
    if (options & XML_PARSE_HTML)
	htmlDocDumpMemory(doc, (xmlChar **) &base, &size);
    else
#endif
    xmlDocDumpMemory(doc, (xmlChar **) &base, &size);
    xmlFreeDoc(doc);
    res = compareFileMem(result, base, size);
    if ((base == NULL) || (res != 0)) {
	if (base != NULL)
	    xmlFree((char *)base);
        fprintf(stderr, "Result for %s failed in %s\n", filename, result);
	return(-1);
    }
    xmlFree((char *)base);
    if (err != NULL) {
	res = compareFileMem(err, testErrors, testErrorsSize);
	if (res != 0) {
	    fprintf(stderr, "Error for %s failed\n", filename);
	    return(-1);
	}
    }
    return(0);
}